

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextProcessDock(ImGuiContext_conflict1 *ctx,ImGuiDockRequest *req)

{
  ImGuiTabItemFlags *pIVar1;
  ImGuiWindow_conflict **ppIVar2;
  int iVar3;
  ImGuiID IVar4;
  ImGuiWindow_conflict *window;
  ImVec2 IVar5;
  ImGuiContext_conflict1 *pIVar6;
  uint uVar7;
  ImGuiID *pIVar8;
  ImGuiDockNode *node;
  ImGuiDockNode *pIVar9;
  ImGuiDockNode *pIVar10;
  ulong uVar11;
  ImGuiDockNode *node_00;
  ImGuiDockNode *pIVar12;
  ImGuiID IVar13;
  long lVar14;
  ImGuiWindow_conflict *window_00;
  ImGuiDockNode *pIVar15;
  ImGuiDockNode *src_node;
  bool bVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  bool local_79;
  
  if (req->Type == ImGuiDockRequestType_Split) {
    if (req->DockPayload != (ImGuiWindow_conflict *)0x0) goto LAB_001db81f;
    window_00 = (ImGuiWindow_conflict *)0x0;
  }
  else if ((req->Type != ImGuiDockRequestType_Dock) ||
          (window_00 = req->DockPayload, window_00 == (ImGuiWindow_conflict *)0x0)) {
LAB_001db81f:
    __assert_fail("(req->Type == ImGuiDockRequestType_Dock && req->DockPayload != __null) || (req->Type == ImGuiDockRequestType_Split && req->DockPayload == __null)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3392,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
  }
  window = req->DockTargetWindow;
  node = req->DockTargetNode;
  if (window == (ImGuiWindow_conflict *)0x0 && node == (ImGuiDockNode *)0x0) {
    __assert_fail("req->DockTargetWindow != __null || req->DockTargetNode != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3393,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
  }
  IVar13 = 0;
  if (window_00 == (ImGuiWindow_conflict *)0x0) {
    src_node = (ImGuiDockNode *)0x0;
  }
  else {
    src_node = window_00->DockNodeAsHost;
    window_00->DockNodeAsHost = (ImGuiDockNode *)0x0;
    if (src_node == (ImGuiDockNode *)0x0) {
      pIVar8 = &window_00->ID;
      src_node = (ImGuiDockNode *)0x0;
LAB_001db2ba:
      IVar13 = *pIVar8;
    }
    else {
      IVar13 = 0;
      if (src_node->ChildNodes[0] == (ImGuiDockNode *)0x0) {
        IVar13 = src_node->TabBar->NextSelectedTabId;
        if (IVar13 == 0) {
          pIVar8 = &src_node->TabBar->SelectedTabId;
          goto LAB_001db2ba;
        }
      }
    }
  }
  if (node == (ImGuiDockNode *)0x0) {
    node = DockContextAddNode(ctx,0);
    node->Pos = window->Pos;
    node->Size = window->Size;
    if (window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
      DockNodeAddWindow(node,window,true);
      if ((node->TabBar->Tabs).Size < 1) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]");
      }
      pIVar1 = &((node->TabBar->Tabs).Data)->Flags;
      *pIVar1 = *pIVar1 & 0xffbfffff;
      window->field_0x3e1 = window->field_0x3e1 | 1;
    }
  }
  else {
    if (ctx->FrameCount < node->LastFrameAlive) {
      __assert_fail("node->LastFrameAlive <= g.FrameCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x33b0,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)"
                   );
    }
    if ((((window != (ImGuiWindow_conflict *)0x0) && (node == window->DockNodeAsHost)) &&
        ((node->Windows).Size < 1)) &&
       ((node->ChildNodes[0] == (ImGuiDockNode *)0x0 && ((node->MergedFlags & 0x800) == 0)))) {
      __assert_fail("node->Windows.Size > 0 || node->IsSplitNode() || node->IsCentralNode()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x33b2,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)"
                   );
    }
  }
  pIVar6 = GImGui;
  uVar7 = req->DockSplitDir;
  if (uVar7 == 0xffffffff) goto LAB_001db5f6;
  fVar19 = req->DockSplitRatio;
  if (src_node == (ImGuiDockNode *)0x0 || (uVar7 & 0xfffffffd) != 0) {
    local_79 = (uVar7 & 0xfffffffd) != 0;
    pIVar9 = DockContextAddNode(ctx,0);
    pIVar9->ParentNode = node;
    pIVar10 = src_node;
    if (src_node == (ImGuiDockNode *)0x0 || !local_79) goto LAB_001db422;
  }
  else {
    local_79 = (uVar7 & 0xfffffffd) != 0;
    src_node->ParentNode = node;
    pIVar9 = src_node;
LAB_001db422:
    pIVar10 = DockContextAddNode(ctx,0);
  }
  bVar16 = (uVar7 & 0xfffffffd) == 0;
  pIVar10->ParentNode = node;
  pIVar15 = pIVar9;
  if (bVar16) {
    pIVar15 = pIVar10;
  }
  DockNodeMoveChildNodes(pIVar15,node);
  node->ChildNodes[0] = pIVar9;
  node->ChildNodes[1] = pIVar10;
  node->ChildNodes[bVar16]->VisibleWindow = node->VisibleWindow;
  node->SplitAxis = (uint)(1 < uVar7);
  node->VisibleWindow = (ImGuiWindow_conflict *)0x0;
  *(ushort *)&node->field_0xbc = (ushort)*(undefined4 *)&node->field_0xbc & 0xffc0 | 9;
  uVar11 = (ulong)((uint)(1 < uVar7) * 4);
  fVar18 = *(float *)((long)node->ChildNodes + uVar11 + 0x30) + -2.0;
  fVar20 = *(float *)((long)&(pIVar6->Style).WindowMinSize.x + uVar11);
  fVar20 = fVar20 + fVar20;
  uVar17 = -(uint)(fVar20 <= fVar18);
  fVar20 = (float)(~uVar17 & (uint)fVar20 | (uint)fVar18 & uVar17);
  if (fVar20 <= 0.0) {
    __assert_fail("size_avail > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3a6e,
                  "void ImGui::DockNodeTreeSplit(ImGuiContext *, ImGuiDockNode *, ImGuiAxis, int, float, ImGuiDockNode *)"
                 );
  }
  IVar5 = node->Size;
  pIVar10->SizeRef = IVar5;
  pIVar9->SizeRef = IVar5;
  fVar19 = (float)(int)(fVar19 * fVar20);
  lVar14 = (ulong)(1 < uVar7) * 4;
  *(float *)((long)pIVar9->ChildNodes + lVar14 + 0x38) = fVar19;
  *(float *)((long)pIVar10->ChildNodes + lVar14 + 0x38) = (float)(int)(fVar20 - fVar19);
  DockNodeMoveWindows(node->ChildNodes[bVar16],node);
  DockSettingsRenameNodeReferences(node->ID,node->ChildNodes[bVar16]->ID);
  pIVar12 = node;
  do {
    node_00 = pIVar12;
    pIVar12 = node_00->ParentNode;
  } while (pIVar12 != (ImGuiDockNode *)0x0);
  DockNodeUpdateHasCentralNodeChild(node_00);
  DockNodeTreeUpdatePosSize(node,node->Pos,node->Size,false);
  uVar7 = node->SharedFlags;
  pIVar9->SharedFlags = uVar7;
  pIVar10->SharedFlags = uVar7;
  pIVar15->LocalFlags = node->LocalFlags & 0xc1f870;
  uVar17 = node->LocalFlags & 0xff3e078f;
  node->LocalFlags = uVar17;
  pIVar9->MergedFlags = pIVar9->LocalFlags | pIVar9->SharedFlags | pIVar9->LocalFlagsInWindows;
  pIVar10->MergedFlags = pIVar10->LocalFlags | pIVar10->LocalFlagsInWindows | uVar7;
  node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | uVar17;
  pIVar9 = node;
  if ((pIVar15->MergedFlags & 0x800) != 0) {
    do {
      pIVar10 = pIVar9;
      pIVar9 = pIVar10->ParentNode;
    } while (pIVar9 != (ImGuiDockNode *)0x0);
    pIVar10->CentralNode = pIVar15;
  }
  ppIVar2 = &node->HostWindow;
  node = node->ChildNodes[local_79];
  node->HostWindow = *ppIVar2;
LAB_001db5f6:
  uVar7 = node->LocalFlags & 0xffffdfff;
  node->LocalFlags = uVar7;
  node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | uVar7;
  if (node == src_node) {
    node->field_0xbe = node->field_0xbe | 2;
  }
  else {
    if ((node->Windows).Size < 1) {
      bVar16 = false;
    }
    else {
      bVar16 = true;
      if (node->TabBar == (ImGuiTabBar *)0x0) {
        DockNodeAddTabBar(node);
        if ((node->Windows).Size < 1) {
          bVar16 = false;
        }
        else {
          lVar14 = 0;
          do {
            TabBarAddTab(node->TabBar,0,(ImGuiWindow *)(node->Windows).Data[lVar14]);
            lVar14 = lVar14 + 1;
            iVar3 = (node->Windows).Size;
          } while (lVar14 < iVar3);
          bVar16 = 0 < iVar3;
        }
      }
    }
    if (src_node == (ImGuiDockNode *)0x0) {
      if (window_00 != (ImGuiWindow_conflict *)0x0) {
        IVar4 = window_00->DockId;
        node->VisibleWindow = window_00;
        DockNodeAddWindow(node,window_00,true);
        if (IVar4 != 0) {
          DockSettingsRenameNodeReferences(IVar4,node->ID);
        }
      }
    }
    else {
      if (src_node->ChildNodes[0] == (ImGuiDockNode *)0x0) {
        IVar4 = src_node->ID;
        DockNodeMoveWindows(node,src_node);
        DockSettingsRenameNodeReferences(IVar4,node->ID);
      }
      else {
        if (bVar16) {
          pIVar9 = src_node->OnlyNodeWithWindows;
          if (pIVar9 == (ImGuiDockNode *)0x0) {
            __assert_fail("payload_node->OnlyNodeWithWindows != __null",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                          ,0x33e4,
                          "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
          }
          if ((pIVar9->TabBar != (ImGuiTabBar *)0x0) && ((pIVar9->TabBar->Tabs).Size < 1)) {
            __assert_fail("visible_node->TabBar->Tabs.Size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                          ,0x33e7,
                          "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
          }
          DockNodeMoveWindows(node,pIVar9);
          DockNodeMoveWindows(pIVar9,node);
          DockSettingsRenameNodeReferences(node->ID,pIVar9->ID);
        }
        if ((node->MergedFlags & 0x800) != 0) {
          pIVar10 = (ImGuiDockNode *)
                    ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,src_node->LastFocusedNodeId);
          pIVar9 = pIVar10;
          if (pIVar10 == (ImGuiDockNode *)0x0) {
            __assert_fail("last_focused_node != __null",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                          ,0x33f1,
                          "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
          }
          do {
            pIVar12 = pIVar9;
            pIVar9 = pIVar12->ParentNode;
            pIVar15 = src_node;
          } while (pIVar12->ParentNode != (ImGuiDockNode *)0x0);
          do {
            pIVar9 = pIVar15;
            pIVar15 = pIVar9->ParentNode;
          } while (pIVar15 != (ImGuiDockNode *)0x0);
          if (pIVar12 != pIVar9) {
            __assert_fail("last_focused_root_node == DockNodeGetRootNode(payload_node)",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                          ,0x33f3,
                          "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
          }
          uVar7 = pIVar10->LocalFlags | 0x800;
          pIVar10->LocalFlags = uVar7;
          pIVar10->MergedFlags = pIVar10->SharedFlags | pIVar10->LocalFlagsInWindows | uVar7;
          uVar7 = node->LocalFlags & 0xfffff7ff;
          node->LocalFlags = uVar7;
          node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | uVar7;
          pIVar12->CentralNode = pIVar10;
        }
        if ((node->Windows).Size != 0) {
          __assert_fail("node->Windows.Size == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                        ,0x33f9,
                        "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
        }
        DockNodeMoveChildNodes(node,src_node);
      }
      DockContextRemoveNode(ctx,src_node,true);
    }
  }
  if (node->TabBar != (ImGuiTabBar *)0x0) {
    node->TabBar->NextSelectedTabId = IVar13;
  }
  if (GImGui->SettingsDirtyTimer <= 0.0) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  return;
}

Assistant:

void ImGui::DockContextProcessDock(ImGuiContext* ctx, ImGuiDockRequest* req)
{
    IM_ASSERT((req->Type == ImGuiDockRequestType_Dock && req->DockPayload != NULL) || (req->Type == ImGuiDockRequestType_Split && req->DockPayload == NULL));
    IM_ASSERT(req->DockTargetWindow != NULL || req->DockTargetNode != NULL);

    ImGuiContext& g = *ctx;
    IM_UNUSED(g);

    ImGuiWindow* payload_window = req->DockPayload;     // Optional
    ImGuiWindow* target_window = req->DockTargetWindow;
    ImGuiDockNode* node = req->DockTargetNode;
    if (payload_window)
        IMGUI_DEBUG_LOG_DOCKING("DockContextProcessDock node 0x%08X target '%s' dock window '%s', split_dir %d\n", node ? node->ID : 0, target_window ? target_window->Name : "NULL", payload_window ? payload_window->Name : "NULL", req->DockSplitDir);
    else
        IMGUI_DEBUG_LOG_DOCKING("DockContextProcessDock node 0x%08X, split_dir %d\n", node ? node->ID : 0, req->DockSplitDir);

    // Decide which Tab will be selected at the end of the operation
    ImGuiID next_selected_id = 0;
    ImGuiDockNode* payload_node = NULL;
    if (payload_window)
    {
        payload_node = payload_window->DockNodeAsHost;
        payload_window->DockNodeAsHost = NULL; // Important to clear this as the node will have its life as a child which might be merged/deleted later.
        if (payload_node && payload_node->IsLeafNode())
            next_selected_id = payload_node->TabBar->NextSelectedTabId ? payload_node->TabBar->NextSelectedTabId : payload_node->TabBar->SelectedTabId;
        if (payload_node == NULL)
            next_selected_id = payload_window->ID;
    }

    // FIXME-DOCK: When we are trying to dock an existing single-window node into a loose window, transfer Node ID as well
    // When processing an interactive split, usually LastFrameAlive will be < g.FrameCount. But DockBuilder operations can make it ==.
    if (node)
        IM_ASSERT(node->LastFrameAlive <= g.FrameCount);
    if (node && target_window && node == target_window->DockNodeAsHost)
        IM_ASSERT(node->Windows.Size > 0 || node->IsSplitNode() || node->IsCentralNode());

    // Create new node and add existing window to it
    if (node == NULL)
    {
        node = DockContextAddNode(ctx, 0);
        node->Pos = target_window->Pos;
        node->Size = target_window->Size;
        if (target_window->DockNodeAsHost == NULL)
        {
            DockNodeAddWindow(node, target_window, true);
            node->TabBar->Tabs[0].Flags &= ~ImGuiTabItemFlags_Unsorted;
            target_window->DockIsActive = true;
        }
    }

    ImGuiDir split_dir = req->DockSplitDir;
    if (split_dir != ImGuiDir_None)
    {
        // Split into two, one side will be our payload node unless we are dropping a loose window
        const ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        const int split_inheritor_child_idx = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? 1 : 0; // Current contents will be moved to the opposite side
        const float split_ratio = req->DockSplitRatio;
        DockNodeTreeSplit(ctx, node, split_axis, split_inheritor_child_idx, split_ratio, payload_node);  // payload_node may be NULL here!
        ImGuiDockNode* new_node = node->ChildNodes[split_inheritor_child_idx ^ 1];
        new_node->HostWindow = node->HostWindow;
        node = new_node;
    }
    node->SetLocalFlags(node->LocalFlags & ~ImGuiDockNodeFlags_HiddenTabBar);

    if (node != payload_node)
    {
        // Create tab bar before we call DockNodeMoveWindows (which would attempt to move the old tab-bar, which would lead us to payload tabs wrongly appearing before target tabs!)
        if (node->Windows.Size > 0 && node->TabBar == NULL)
        {
            DockNodeAddTabBar(node);
            for (int n = 0; n < node->Windows.Size; n++)
                TabBarAddTab(node->TabBar, ImGuiTabItemFlags_None, node->Windows[n]);
        }

        if (payload_node != NULL)
        {
            // Transfer full payload node (with 1+ child windows or child nodes)
            if (payload_node->IsSplitNode())
            {
                if (node->Windows.Size > 0)
                {
                    // We can dock a split payload into a node that already has windows _only_ if our payload is a node tree with a single visible node.
                    // In this situation, we move the windows of the target node into the currently visible node of the payload.
                    // This allows us to preserve some of the underlying dock tree settings nicely.
                    IM_ASSERT(payload_node->OnlyNodeWithWindows != NULL); // The docking should have been blocked by DockNodePreviewDockSetup() early on and never submitted.
                    ImGuiDockNode* visible_node = payload_node->OnlyNodeWithWindows;
                    if (visible_node->TabBar)
                        IM_ASSERT(visible_node->TabBar->Tabs.Size > 0);
                    DockNodeMoveWindows(node, visible_node);
                    DockNodeMoveWindows(visible_node, node);
                    DockSettingsRenameNodeReferences(node->ID, visible_node->ID);
                }
                if (node->IsCentralNode())
                {
                    // Central node property needs to be moved to a leaf node, pick the last focused one.
                    // FIXME-DOCK: If we had to transfer other flags here, what would the policy be?
                    ImGuiDockNode* last_focused_node = DockContextFindNodeByID(ctx, payload_node->LastFocusedNodeId);
                    IM_ASSERT(last_focused_node != NULL);
                    ImGuiDockNode* last_focused_root_node = DockNodeGetRootNode(last_focused_node);
                    IM_ASSERT(last_focused_root_node == DockNodeGetRootNode(payload_node));
                    last_focused_node->SetLocalFlags(last_focused_node->LocalFlags |= ImGuiDockNodeFlags_CentralNode);
                    node->SetLocalFlags(node->LocalFlags & ~ImGuiDockNodeFlags_CentralNode);
                    last_focused_root_node->CentralNode = last_focused_node;
                }

                IM_ASSERT(node->Windows.Size == 0);
                DockNodeMoveChildNodes(node, payload_node);
            }
            else
            {
                const ImGuiID payload_dock_id = payload_node->ID;
                DockNodeMoveWindows(node, payload_node);
                DockSettingsRenameNodeReferences(payload_dock_id, node->ID);
            }
            DockContextRemoveNode(ctx, payload_node, true);
        }
        else if (payload_window)
        {
            // Transfer single window
            const ImGuiID payload_dock_id = payload_window->DockId;
            node->VisibleWindow = payload_window;
            DockNodeAddWindow(node, payload_window, true);
            if (payload_dock_id != 0)
                DockSettingsRenameNodeReferences(payload_dock_id, node->ID);
        }
    }
    else
    {
        // When docking a floating single window node we want to reevaluate auto-hiding of the tab bar
        node->WantHiddenTabBarUpdate = true;
    }

    // Update selection immediately
    if (ImGuiTabBar* tab_bar = node->TabBar)
        tab_bar->NextSelectedTabId = next_selected_id;
    MarkIniSettingsDirty();
}